

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.hpp
# Opt level: O2

uint32_t * __thiscall spirv_cross::Compiler::stream(Compiler *this,Instruction *instr)

{
  uint uVar1;
  uint uVar2;
  pointer puVar3;
  ulong uVar4;
  uint32_t *puVar5;
  CompilerError *this_00;
  
  uVar1 = instr->length;
  if ((ulong)uVar1 == 0) {
    puVar5 = (uint32_t *)0x0;
  }
  else {
    uVar2 = instr->offset;
    if ((ulong)uVar2 == 0) {
      uVar4._0_2_ = instr[2].op;
      uVar4._2_2_ = instr[2].count;
      uVar4._4_4_ = instr[2].offset;
      if (uVar4 != uVar1) {
        __assert_fail("embedded.ops.size() == instr.length",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_cross.hpp"
                      ,0x22b,
                      "const uint32_t *spirv_cross::Compiler::stream(const Instruction &) const");
      }
      puVar5 = *(uint32_t **)&instr[1].offset;
    }
    else {
      puVar3 = (this->ir).spirv.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->ir).spirv.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar3 >> 2) <
          (ulong)(uVar1 + uVar2)) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Compiler::stream() out of range.");
        __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      puVar5 = puVar3 + uVar2;
    }
  }
  return puVar5;
}

Assistant:

const uint32_t *stream(const Instruction &instr) const
	{
		// If we're not going to use any arguments, just return nullptr.
		// We want to avoid case where we return an out of range pointer
		// that trips debug assertions on some platforms.
		if (!instr.length)
			return nullptr;

		if (instr.is_embedded())
		{
			auto &embedded = static_cast<const EmbeddedInstruction &>(instr);
			assert(embedded.ops.size() == instr.length);
			return embedded.ops.data();
		}
		else
		{
			if (instr.offset + instr.length > ir.spirv.size())
				SPIRV_CROSS_THROW("Compiler::stream() out of range.");
			return &ir.spirv[instr.offset];
		}
	}